

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QRhiSwapChainHdrInfo *info)

{
  int *in_RDX;
  QTextStream *pQVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)info);
  pQVar1 = *(QTextStream **)info;
  pQVar1[0x30] = (QTextStream)0x0;
  QVar2.m_data = (storage_type *)0x15;
  QVar2.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar2);
  QTextStream::operator<<(pQVar1,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if ((*(QTextStream **)info)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)info,' ');
  }
  if (*in_RDX == 1) {
    pQVar1 = *(QTextStream **)info;
    pQVar1[0x30] = (QTextStream)0x0;
    QVar6.m_data = (storage_type *)0x18;
    QVar6.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<(pQVar1,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    pQVar1 = *(QTextStream **)info;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
      pQVar1 = *(QTextStream **)info;
    }
    QTextStream::operator<<(pQVar1,(float)in_RDX[1]);
    pQVar1 = *(QTextStream **)info;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
      pQVar1 = *(QTextStream **)info;
    }
    pQVar1[0x30] = (QTextStream)0x0;
    QVar7.m_data = (storage_type *)0x21;
    QVar7.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(pQVar1,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    pQVar1 = *(QTextStream **)info;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
      pQVar1 = *(QTextStream **)info;
    }
    QTextStream::operator<<(pQVar1,(float)in_RDX[2]);
    pQVar1 = *(QTextStream **)info;
    if (pQVar1[0x30] == (QTextStream)0x1) {
LAB_0044d5fb:
      QTextStream::operator<<(pQVar1,' ');
    }
  }
  else if (*in_RDX == 0) {
    pQVar1 = *(QTextStream **)info;
    pQVar1[0x30] = (QTextStream)0x0;
    QVar3.m_data = (storage_type *)0xe;
    QVar3.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<(pQVar1,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    pQVar1 = *(QTextStream **)info;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
      pQVar1 = *(QTextStream **)info;
    }
    QTextStream::operator<<(pQVar1,(float)in_RDX[1]);
    pQVar1 = *(QTextStream **)info;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
      pQVar1 = *(QTextStream **)info;
    }
    QVar4.m_data = (storage_type *)0xe;
    QVar4.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<(pQVar1,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    pQVar1 = *(QTextStream **)info;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
      pQVar1 = *(QTextStream **)info;
    }
    QTextStream::operator<<(pQVar1,(float)in_RDX[2]);
    pQVar1 = *(QTextStream **)info;
    if (pQVar1[0x30] != (QTextStream)0x0) goto LAB_0044d5fb;
  }
  if (in_RDX[3] == 1) {
    pQVar1 = *(QTextStream **)info;
    pQVar1[0x30] = (QTextStream)0x0;
    QVar8.m_data = (storage_type *)0x11;
    QVar8.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<(pQVar1,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    pQVar1 = *(QTextStream **)info;
    if (pQVar1[0x30] != (QTextStream)0x1) goto LAB_0044d69d;
  }
  else {
    if (in_RDX[3] != 0) goto LAB_0044d69d;
    pQVar1 = *(QTextStream **)info;
    pQVar1[0x30] = (QTextStream)0x0;
    QVar5.m_data = (storage_type *)0x21;
    QVar5.m_size = (qsizetype)local_48;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<(pQVar1,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
    pQVar1 = *(QTextStream **)info;
    if (pQVar1[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar1,' ');
      pQVar1 = *(QTextStream **)info;
    }
    QTextStream::operator<<(pQVar1,(float)in_RDX[4]);
    pQVar1 = *(QTextStream **)info;
    if (pQVar1[0x30] == (QTextStream)0x0) goto LAB_0044d69d;
  }
  QTextStream::operator<<(pQVar1,' ');
LAB_0044d69d:
  pQVar1 = *(QTextStream **)info;
  pQVar1[0x30] = (QTextStream)0x0;
  QTextStream::operator<<(pQVar1,')');
  pQVar1 = *(QTextStream **)info;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = *(QTextStream **)info;
  }
  *(undefined8 *)info = 0;
  *(QTextStream **)dbg.stream = pQVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiSwapChainHdrInfo &info)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiSwapChainHdrInfo(";
    switch (info.limitsType) {
    case QRhiSwapChainHdrInfo::LuminanceInNits:
        dbg.nospace() << " minLuminance=" << info.limits.luminanceInNits.minLuminance
                      << " maxLuminance=" << info.limits.luminanceInNits.maxLuminance;
        break;
    case QRhiSwapChainHdrInfo::ColorComponentValue:
        dbg.nospace() << " maxColorComponentValue=" << info.limits.colorComponentValue.maxColorComponentValue;
        dbg.nospace() << " maxPotentialColorComponentValue=" << info.limits.colorComponentValue.maxPotentialColorComponentValue;
        break;
    }
    switch (info.luminanceBehavior) {
    case QRhiSwapChainHdrInfo::SceneReferred:
        dbg.nospace() << " scene-referred, SDR white level=" << info.sdrWhiteLevel;
        break;
    case QRhiSwapChainHdrInfo::DisplayReferred:
        dbg.nospace() << " display-referred";
        break;
    }
    dbg.nospace() << ')';
    return dbg;
}